

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O1

Index __thiscall wasm::Pusher::optimizeSegment(Pusher *this,Index firstPushable,Index pushPoint)

{
  ulong uVar1;
  Expression **ppEVar2;
  bool bVar3;
  EffectAnalyzer *other;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  undefined1 local_1b8 [8];
  EffectAnalyzer cumulativeEffects;
  LocalSet *pushable;
  void *pvStack_48;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> toPush;
  
  if ((pushPoint <= firstPushable) || (uVar8 = (ulong)pushPoint, pushPoint == 0xffffffff)) {
    __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                  ,0xb6,"Index wasm::Pusher::optimizeSegment(Index, Index)");
  }
  cumulativeEffects._0_8_ = this->module;
  local_1b8[0] = this->passOptions->ignoreImplicitTraps;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.localsRead;
  local_1b8[1] = this->passOptions->trapsNeverHappen;
  cumulativeEffects.module._0_4_ = (((Module *)cumulativeEffects._0_8_)->features).features;
  cumulativeEffects.module._4_2_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.localsWritten;
  cumulativeEffects.localsWritten._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.mutableGlobalsRead;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.globalsWritten;
  cumulativeEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.breakTargets;
  cumulativeEffects.breakTargets._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.readsMemory = false;
  cumulativeEffects.writesMemory = false;
  cumulativeEffects.readsTable = false;
  cumulativeEffects.writesTable = false;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cumulativeEffects.trap = false;
  cumulativeEffects.implicitTrap = false;
  cumulativeEffects.isAtomic = false;
  cumulativeEffects.throws_ = false;
  cumulativeEffects._228_4_ = 0;
  cumulativeEffects.tryDepth._0_7_ = 0;
  cumulativeEffects._239_4_ = 0;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&cumulativeEffects.delegateTargets;
  cumulativeEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
      usedElements <= uVar8) {
LAB_007fb662:
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  }
  EffectAnalyzer::walk
            ((EffectAnalyzer *)local_1b8,
             (this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             ).data[uVar8]);
  EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_1b8);
  pvStack_48 = (void *)0x0;
  toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = pushPoint - 1;
  do {
    uVar4 = (ulong)uVar7;
    if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
        usedElements <= uVar4) goto LAB_007fb662;
    cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)isPushable(this,(this->list->
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ).data[uVar4]);
    if ((LocalSet *)
        cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (LocalSet *)0x0) {
      if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements <= uVar4) goto LAB_007fb662;
      EffectAnalyzer::walk
                ((EffectAnalyzer *)local_1b8,
                 (this->list->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                 [uVar4]);
    }
    else {
      other = getPushableEffects(this,(LocalSet *)
                                      cumulativeEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
      bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_1b8,other);
      if (bVar3) {
        EffectAnalyzer::mergeIn((EffectAnalyzer *)local_1b8,other);
      }
      else if (toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::
        _M_realloc_insert<wasm::LocalSet*const&>
                  ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)&pvStack_48,
                   (iterator)
                   toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (LocalSet **)
                   &cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
      }
      else {
        *toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
         super__Vector_impl_data._M_start =
             (LocalSet *)
             cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    }
    uVar6 = uVar7;
    if (uVar7 != firstPushable) {
      if (uVar7 == 0) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                      ,0xde,"Index wasm::Pusher::optimizeSegment(Index, Index)");
      }
      uVar6 = uVar7 - 1;
    }
    bVar3 = uVar7 != firstPushable;
    uVar7 = uVar6;
  } while (bVar3);
  if ((long)toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pvStack_48 != 0) {
    uVar4 = (ulong)((long)toPush.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)pvStack_48) >> 3;
    uVar6 = 0;
    uVar7 = (uint)uVar4;
    if (firstPushable <= pushPoint) {
      uVar5 = (ulong)firstPushable;
      iVar9 = (pushPoint - firstPushable) + 1;
      uVar6 = 0;
      do {
        if (uVar6 < uVar7) {
          if ((this->list->
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
              usedElements <= uVar5) goto LAB_007fb662;
          if ((this->list->
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
              [uVar5] != *(Expression **)((long)pvStack_48 + (ulong)(~uVar6 + uVar7) * 8))
          goto LAB_007fb573;
          uVar6 = uVar6 + 1;
        }
        else {
LAB_007fb573:
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            uVar1 = (this->list->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                    usedElements;
            if ((uVar1 <= uVar5) || (uVar10 = (ulong)((int)uVar5 - uVar6), uVar1 <= uVar10))
            goto LAB_007fb662;
            ppEVar2 = (this->list->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                      data;
            ppEVar2[uVar10] = ppEVar2[uVar5];
          }
        }
        uVar5 = uVar5 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if (uVar6 != uVar7) {
      __assert_fail("skip == total",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CodePushing.cpp"
                    ,0xf4,"Index wasm::Pusher::optimizeSegment(Index, Index)");
    }
    if (uVar7 != 0) {
      uVar5 = 0;
      do {
        if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
            .usedElements <= uVar8) goto LAB_007fb662;
        (this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
        data[uVar8] = *(Expression **)((long)pvStack_48 + uVar5 * 8);
        uVar5 = uVar5 + 1;
        uVar8 = (ulong)((int)uVar8 - 1);
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
    pushPoint = pushPoint - uVar7;
  }
  if (pvStack_48 != (void *)0x0) {
    operator_delete(pvStack_48,
                    (long)toPush.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvStack_48);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&cumulativeEffects.features);
  return pushPoint + 1;
}

Assistant:

Index optimizeSegment(Index firstPushable, Index pushPoint) {
    // The interesting part. Starting at firstPushable, try to push
    // code past pushPoint. We start at the end since we are pushing
    // forward, that way we can push later things out of the way
    // of earlier ones. Once we know all we can push, we push it all
    // in one pass, keeping the order of the pushables intact.
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);
    // everything that matters if you want to be pushed past the pushPoint
    EffectAnalyzer cumulativeEffects(passOptions, module);
    cumulativeEffects.walk(list[pushPoint]);
    // It is ok to ignore branching out of the block here, that is the crucial
    // point of this optimization. That is, we are in a situation like this:
    //
    // {
    //   x = value;
    //   if (..) break;
    //   foo(x);
    // }
    //
    // If the branch is taken, then that's fine, it will jump out of this block
    // and reach some outer scope, and in that case we never need x at all
    // (since we've proven before that x is not used outside of this block, see
    // numGetsSoFar which we use for that). Similarly, control flow could
    // transfer away via a return or an exception and that would be ok as well.
    cumulativeEffects.ignoreControlFlowTransfers();
    std::vector<LocalSet*> toPush;
    Index i = pushPoint - 1;
    while (1) {
      auto* pushable = isPushable(list[i]);
      if (pushable) {
        const auto& effects = getPushableEffects(pushable);
        if (cumulativeEffects.invalidates(effects)) {
          // we can't push this, so further pushables must pass it
          cumulativeEffects.mergeIn(effects);
        } else {
          // we can push this, great!
          toPush.push_back(pushable);
        }
      } else {
        // something that can't be pushed, so it might block further pushing
        cumulativeEffects.walk(list[i]);
      }
      if (i == firstPushable) {
        // no point in looking further
        break;
      }
      assert(i > 0);
      i--;
    }
    if (toPush.size() == 0) {
      // nothing to do, can only continue after the push point
      return pushPoint + 1;
    }
    // we have work to do!
    Index total = toPush.size();
    Index last = total - 1;
    Index skip = 0;
    for (Index i = firstPushable; i <= pushPoint; i++) {
      // we see the first elements at the end of toPush
      if (skip < total && list[i] == toPush[last - skip]) {
        // this is one of our elements to push, skip it
        skip++;
      } else {
        if (skip) {
          list[i - skip] = list[i];
        }
      }
    }
    assert(skip == total);
    // write out the skipped elements
    for (Index i = 0; i < total; i++) {
      list[pushPoint - i] = toPush[i];
    }
    // proceed right after the push point, we may push the pushed elements again
    return pushPoint - total + 1;
  }